

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

lest * __thiscall lest::to_string<unsigned_long>(lest *this,unsigned_long *value)

{
  string_maker<unsigned_long> local_38 [32];
  unsigned_long *local_18;
  unsigned_long *value_local;
  
  local_18 = value;
  value_local = (unsigned_long *)this;
  string_maker<unsigned_long>::to_string_abi_cxx11_(local_38,value);
  std::__cxx11::string::string((string *)this,(string *)local_38);
  std::__cxx11::string::~string((string *)local_38);
  return this;
}

Assistant:

inline std::string to_string( T const & value )
{
    return string_maker<T>::to_string( value );
}